

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetErrFile(void *kinmem,FILE *errfp)

{
  KINMem kin_mem;
  FILE *errfp_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetErrFile","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else {
    *(FILE **)((long)kinmem + 0x260) = errfp;
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetErrFile(void *kinmem, FILE *errfp)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetErrFile", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  kin_mem->kin_errfp = errfp;

  return(KIN_SUCCESS);
}